

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treeitem.cpp
# Opt level: O0

UINT8 __thiscall TreeItem::insertChildAfter(TreeItem *this,TreeItem *item,TreeItem *newItem)

{
  bool bVar1;
  _Self *__x;
  const_iterator local_50;
  _Self local_48;
  _List_node_base *local_40;
  _List_iterator<TreeItem_*> local_38;
  _Self local_30;
  iterator found;
  TreeItem *newItem_local;
  TreeItem *item_local;
  TreeItem *this_local;
  
  found._M_node = (_List_node_base *)newItem;
  newItem_local = item;
  item_local = this;
  local_38._M_node =
       (_List_node_base *)
       std::__cxx11::list<TreeItem_*,_std::allocator<TreeItem_*>_>::begin(&this->childItems);
  local_40 = (_List_node_base *)
             std::__cxx11::list<TreeItem_*,_std::allocator<TreeItem_*>_>::end(&this->childItems);
  local_30._M_node =
       (_List_node_base *)
       std::find<std::_List_iterator<TreeItem*>,TreeItem*>
                 (local_38,(_List_iterator<TreeItem_*>)local_40,&newItem_local);
  local_48._M_node =
       (_List_node_base *)
       std::__cxx11::list<TreeItem_*,_std::allocator<TreeItem_*>_>::end(&this->childItems);
  bVar1 = std::operator==(&local_30,&local_48);
  if (bVar1) {
    this_local._7_1_ = '\b';
  }
  else {
    __x = std::_List_iterator<TreeItem_*>::operator++(&local_30);
    std::_List_const_iterator<TreeItem_*>::_List_const_iterator(&local_50,__x);
    std::__cxx11::list<TreeItem_*,_std::allocator<TreeItem_*>_>::insert
              (&this->childItems,local_50,(value_type *)&found);
    this_local._7_1_ = '\0';
  }
  return this_local._7_1_;
}

Assistant:

UINT8 TreeItem::insertChildAfter(TreeItem *item, TreeItem *newItem)
{
    std::list<TreeItem*>::iterator found = std::find(childItems.begin(), childItems.end(), item);
    if (found == childItems.end())
        return U_ITEM_NOT_FOUND;
    childItems.insert(++found, newItem);
    return U_SUCCESS;
}